

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.hpp
# Opt level: O0

void __thiscall
asio::io_context::basic_executor_type<std::allocator<void>,0ul>::
execute<asio::detail::binder0<std::function<void()>>>
          (basic_executor_type<std::allocator<void>,_0UL> *this,binder0<std::function<void_()>_> *f)

{
  bool bVar1;
  uintptr_t uVar2;
  scheduler *this_00;
  executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
  *in_RDI;
  ptr p;
  fenced_block b;
  function_type tmp;
  binder0<std::function<void_()>_> *in_stack_ffffffffffffff78;
  allocator<void> *in_stack_ffffffffffffff80;
  std_fenced_block *in_stack_ffffffffffffff88;
  executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
  *this_01;
  undefined1 is_continuation;
  scheduler *op;
  
  uVar2 = basic_executor_type<std::allocator<void>,_0UL>::bits
                    ((basic_executor_type<std::allocator<void>,_0UL> *)in_RDI);
  if ((uVar2 & 1) == 0) {
    basic_executor_type<std::allocator<void>,_0UL>::context_ptr
              ((basic_executor_type<std::allocator<void>,_0UL> *)in_RDI);
    bVar1 = detail::scheduler::can_dispatch((scheduler *)0x1bcce7);
    if (bVar1) {
      detail::binder0<std::function<void_()>_>::binder0
                ((binder0<std::function<void_()>_> *)in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff78);
      detail::std_fenced_block::std_fenced_block
                (in_stack_ffffffffffffff88,(full_t)((ulong)in_stack_ffffffffffffff80 >> 0x20));
      asio_handler_invoke_helpers::
      invoke<asio::detail::binder0<std::function<void()>>,asio::detail::binder0<std::function<void()>>>
                ((binder0<std::function<void_()>_> *)in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff78);
      detail::std_fenced_block::~std_fenced_block(in_stack_ffffffffffffff88);
      detail::binder0<std::function<void_()>_>::~binder0
                ((binder0<std::function<void_()>_> *)0x1bcdb9);
      return;
    }
  }
  this_01 = in_RDI;
  this_00 = (scheduler *)
            detail::
            executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
            ::ptr::allocate(in_stack_ffffffffffffff80);
  op = this_00;
  detail::
  executor_op<asio::detail::binder0<std::function<void()>>,std::allocator<void>,asio::detail::scheduler_operation>
  ::executor_op<asio::detail::binder0<std::function<void()>>>
            (this_01,(binder0<std::function<void_()>_> *)in_RDI,(allocator<void> *)this_00);
  is_continuation = (undefined1)((ulong)this_01 >> 0x38);
  basic_executor_type<std::allocator<void>,_0UL>::context_ptr
            ((basic_executor_type<std::allocator<void>,_0UL> *)in_RDI);
  basic_executor_type<std::allocator<void>,_0UL>::bits
            ((basic_executor_type<std::allocator<void>,_0UL> *)in_RDI);
  detail::scheduler::post_immediate_completion(this_00,(operation *)op,(bool)is_continuation);
  detail::
  executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
  ::ptr::~ptr((ptr *)0x1bce76);
  return;
}

Assistant:

void io_context::basic_executor_type<Allocator, Bits>::execute(
    ASIO_MOVE_ARG(Function) f) const
{
  typedef typename decay<Function>::type function_type;

  // Invoke immediately if the blocking.possibly property is enabled and we are
  // already inside the thread pool.
  if ((bits() & blocking_never) == 0 && context_ptr()->impl_.can_dispatch())
  {
    // Make a local, non-const copy of the function.
    function_type tmp(ASIO_MOVE_CAST(Function)(f));

#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    try
    {
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       //   && !defined(ASIO_NO_EXCEPTIONS)
      detail::fenced_block b(detail::fenced_block::full);
      asio_handler_invoke_helpers::invoke(tmp, tmp);
      return;
#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    }
    catch (...)
    {
      context_ptr()->impl_.capture_current_exception();
      return;
    }
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       //   && !defined(ASIO_NO_EXCEPTIONS)
  }

  // Allocate and construct an operation to wrap the function.
  typedef detail::executor_op<function_type, Allocator, detail::operation> op;
  typename op::ptr p = {
      detail::addressof(static_cast<const Allocator&>(*this)),
      op::ptr::allocate(static_cast<const Allocator&>(*this)), 0 };
  p.p = new (p.v) op(ASIO_MOVE_CAST(Function)(f),
      static_cast<const Allocator&>(*this));

  ASIO_HANDLER_CREATION((*context_ptr(), *p.p,
        "io_context", context_ptr(), 0, "execute"));

  context_ptr()->impl_.post_immediate_completion(p.p,
      (bits() & relationship_continuation) != 0);
  p.v = p.p = 0;
}